

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

ChanopenResult *
ssh2_connection_parse_channel_open
          (ChanopenResult *__return_storage_ptr__,ssh2_connection_state *s,ptrlen type,PktIn *pktin,
          SshChannel *sc)

{
  _Bool _Var1;
  int fwdport_00;
  int peerport_00;
  unsigned_long uVar2;
  char *pcVar3;
  ptrlen pVar4;
  ptrlen peeraddr_00;
  ChanopenResult *toret;
  int peerport_1;
  ptrlen peeraddr_1;
  int fwdport;
  ptrlen fwdaddr;
  int peerport;
  ptrlen peeraddr;
  SshChannel *sc_local;
  PktIn *pktin_local;
  ssh2_connection_state *s_local;
  ptrlen type_local;
  
  _Var1 = ptrlen_eq_string(type,"x11");
  if (_Var1) {
    pVar4 = BinarySource_get_string(pktin->binarysource_);
    uVar2 = BinarySource_get_uint32(pktin->binarysource_);
    chan_open_x11(__return_storage_ptr__,s,sc,pVar4,(int)uVar2);
  }
  else {
    _Var1 = ptrlen_eq_string(type,"forwarded-tcpip");
    if (_Var1) {
      pVar4 = BinarySource_get_string(pktin->binarysource_);
      uVar2 = BinarySource_get_uint32(pktin->binarysource_);
      fwdport_00 = toint((uint)uVar2);
      peeraddr_00 = BinarySource_get_string(pktin->binarysource_);
      uVar2 = BinarySource_get_uint32(pktin->binarysource_);
      peerport_00 = toint((uint)uVar2);
      chan_open_forwarded_tcpip
                (__return_storage_ptr__,s,sc,pVar4,fwdport_00,peeraddr_00,peerport_00);
    }
    else {
      _Var1 = ptrlen_eq_string(type,"auth-agent@openssh.com");
      if (_Var1) {
        chan_open_auth_agent(__return_storage_ptr__,s,sc);
      }
      else {
        __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
        (__return_storage_ptr__->u).failure.reason_code = 3;
        pcVar3 = dupprintf("Unsupported channel type requested");
        (__return_storage_ptr__->u).failure.wire_message = pcVar3;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ChanopenResult ssh2_connection_parse_channel_open(
    struct ssh2_connection_state *s, ptrlen type,
    PktIn *pktin, SshChannel *sc)
{
    if (ptrlen_eq_string(type, "x11")) {
        ptrlen peeraddr = get_string(pktin);
        int peerport = get_uint32(pktin);

        return chan_open_x11(s, sc, peeraddr, peerport);
    } else if (ptrlen_eq_string(type, "forwarded-tcpip")) {
        ptrlen fwdaddr = get_string(pktin);
        int fwdport = toint(get_uint32(pktin));
        ptrlen peeraddr = get_string(pktin);
        int peerport = toint(get_uint32(pktin));

        return chan_open_forwarded_tcpip(
            s, sc, fwdaddr, fwdport, peeraddr, peerport);
    } else if (ptrlen_eq_string(type, "auth-agent@openssh.com")) {
        return chan_open_auth_agent(s, sc);
    } else {
        CHANOPEN_RETURN_FAILURE(
            SSH2_OPEN_UNKNOWN_CHANNEL_TYPE,
            ("Unsupported channel type requested"));
    }
}